

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite_info.hpp
# Opt level: O0

string * __thiscall
beast::unit_test::suite_info::full_name_abi_cxx11_(string *__return_storage_ptr__,suite_info *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  suite_info *local_18;
  suite_info *this_local;
  
  local_18 = this;
  this_local = (suite_info *)__return_storage_ptr__;
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                   (char *)&this->library_);
  ::std::operator+(&local_58,&local_78,&this->module_);
  ::std::operator+(&local_38,&local_58,".");
  ::std::operator+(__return_storage_ptr__,&local_38,&this->name_);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string
    full_name() const
    {
        return library_ + "." + module_ + "." + name_;
    }